

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.hpp
# Opt level: O0

void mserialize::detail::
     BuiltinSerializer<std::set<int,_std::less<int>,_std::allocator<int>_>,_void>::
     serialize<binlog::detail::QueueWriter>
               (set<int,_std::less<int>,_std::allocator<int>_> *s,QueueWriter *ostream)

{
  undefined4 uVar1;
  size_type sVar2;
  undefined8 in_RSI;
  undefined8 in_RDI;
  uint32_t size32;
  size_type size;
  QueueWriter *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  
  sVar2 = sequence_size<std::set<int,std::less<int>,std::allocator<int>>>
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)0x1172d8);
  uVar1 = (undefined4)sVar2;
  serialize<unsigned_int,binlog::detail::QueueWriter>
            ((uint *)CONCAT44(uVar1,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8);
  serialize_elems<binlog::detail::QueueWriter>(in_RDI,uVar1,in_RSI);
  return;
}

Assistant:

static void serialize(const Sequence& s, OutputStream& ostream)
  {
    const auto size = sequence_size(s);
    const auto size32 = std::uint32_t(size);
    assert(size32 == size && "sequence size must fit on 32 bits");

    mserialize::serialize(size32, ostream);
    serialize_elems(is_sequence_batch_serializable<const Sequence>{}, s, size32, ostream);
  }